

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

bool __thiscall Parser::IsSpecialName(Parser *this,IdentPtr pid)

{
  undefined4 in_EAX;
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar4._8_4_ = (int)pid;
  auVar4._0_8_ = pid;
  auVar4._12_4_ = (int)((ulong)pid >> 0x20);
  auVar3._0_8_ = -(ulong)((this->wellKnownPropertyPids)._super == pid);
  auVar3._8_8_ = -(ulong)((this->wellKnownPropertyPids)._superConstructor == auVar4._8_8_);
  auVar2._0_8_ = -(ulong)((this->wellKnownPropertyPids)._this == pid);
  auVar2._8_8_ = -(ulong)((this->wellKnownPropertyPids)._newTarget == auVar4._8_8_);
  auVar2 = packssdw(auVar2,auVar3);
  iVar1 = movmskps(in_EAX,auVar2);
  return (this->wellKnownPropertyPids)._importMeta == pid || iVar1 != 0;
}

Assistant:

bool Parser::IsSpecialName(IdentPtr pid)
{
    return pid == wellKnownPropertyPids._this ||
        pid == wellKnownPropertyPids._super ||
        pid == wellKnownPropertyPids._superConstructor ||
        pid == wellKnownPropertyPids._newTarget ||
        pid == wellKnownPropertyPids._importMeta;
}